

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

int Abc_NodeCompareLevelsInc(int *pp1,int *pp2)

{
  void *pvVar1;
  void *pvVar2;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  int *pp2_local;
  int *pp1_local;
  
  pvVar1 = Vec_PtrEntry(s_pLeaves,*pp1);
  pvVar2 = Vec_PtrEntry(s_pLeaves,*pp2);
  if (*(uint *)((long)pvVar1 + 0x14) >> 0xc < *(uint *)((long)pvVar2 + 0x14) >> 0xc) {
    pp1_local._4_4_ = -1;
  }
  else if (*(uint *)((long)pvVar2 + 0x14) >> 0xc < *(uint *)((long)pvVar1 + 0x14) >> 0xc) {
    pp1_local._4_4_ = 1;
  }
  else {
    pp1_local._4_4_ = 0;
  }
  return pp1_local._4_4_;
}

Assistant:

int Abc_NodeCompareLevelsInc( int * pp1, int * pp2 )
{
    Abc_Obj_t * pNode1, * pNode2;
    pNode1 = (Abc_Obj_t *)Vec_PtrEntry(s_pLeaves, *pp1);
    pNode2 = (Abc_Obj_t *)Vec_PtrEntry(s_pLeaves, *pp2);
    if ( pNode1->Level < pNode2->Level )
        return -1;
    if ( pNode1->Level > pNode2->Level ) 
        return 1;
    return 0; 
}